

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O3

c_float vec_scaled_norm_inf(c_float *S,c_float *v,c_int l)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (0 < l) {
    lVar1 = 0;
    dVar3 = 0.0;
    do {
      dVar4 = S[lVar1] * v[lVar1];
      dVar2 = -dVar4;
      if (-dVar4 <= dVar4) {
        dVar2 = dVar4;
      }
      if (dVar2 <= dVar3) {
        dVar2 = dVar3;
      }
      lVar1 = lVar1 + 1;
      dVar3 = dVar2;
    } while (l != lVar1);
    return dVar2;
  }
  return 0.0;
}

Assistant:

c_float vec_scaled_norm_inf(const c_float *S, const c_float *v, c_int l) {
  c_int   i;
  c_float abs_Sv_i;
  c_float max = 0.0;

  for (i = 0; i < l; i++) {
    abs_Sv_i = c_absval(S[i] * v[i]);

    if (abs_Sv_i > max) max = abs_Sv_i;
  }
  return max;
}